

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_92e1f6::HandleHexCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  long lVar5;
  long lVar6;
  string_view value;
  allocator<char> local_69;
  string output;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar6 == 0x60) {
    output._M_dataplus._M_p = (pointer)&output.field_2;
    std::__cxx11::string::_M_construct((ulong)&output,(char)pbVar1[1]._M_string_length * '\x02');
    pcVar2 = pbVar1[1]._M_dataplus._M_p;
    sVar3 = pbVar1[1]._M_string_length;
    lVar5 = 0;
    for (sVar4 = 0; sVar3 != sVar4; sVar4 = sVar4 + 1) {
      snprintf(output._M_dataplus._M_p + lVar5,3,"%.2x",(ulong)(byte)pcVar2[sVar4]);
      lVar5 = lVar5 + 2;
    }
    value._M_str = output._M_dataplus._M_p;
    value._M_len = output._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,pbVar1 + 2,value);
    std::__cxx11::string::~string((string *)&output);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"Incorrect number of arguments",&local_69);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&output);
  }
  return lVar6 == 0x60;
}

Assistant:

bool HandleHexCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError("Incorrect number of arguments");
    return false;
  }
  auto const& instr = args[1];
  auto const& outvar = args[2];
  std::string output(instr.size() * 2, ' ');

  std::string::size_type hexIndex = 0;
  for (auto const& c : instr) {
    snprintf(&output[hexIndex], 3, "%.2x",
             static_cast<unsigned char>(c) & 0xFF);
    hexIndex += 2;
  }

  status.GetMakefile().AddDefinition(outvar, output);
  return true;
}